

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCpBcc<(moira::Instr)147,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  i32 iVar1;
  StrWriter *pSVar2;
  Int local_4c;
  UInt local_48;
  Ims<2> local_44;
  int local_40;
  Cpcc local_3c [2];
  u32 local_34;
  uint local_30;
  u32 ext2;
  u32 disp;
  u32 ext1;
  u32 pc;
  u8 cnd;
  u8 id;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  ext1._2_2_ = op;
  _pc = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if ((str->style->syntax == GNU) || (str->style->syntax == GNU_MIT)) {
    dasmIllegal<(moira::Instr)147,(moira::Mode)12,2>(this,str,addr,op);
  }
  else {
    ext1._1_1_ = (byte)((int)(uint)op >> 9) & 7;
    ext1._0_1_ = (byte)op & 0x3f;
    disp = *addr + 2;
    ext2 = dasmIncRead<2>(this,addr);
    local_30 = dasmIncRead<2>(this,_pc);
    local_34 = dasmIncRead<2>(this,_pc);
    iVar1 = SEXT<2>((ulong)local_30);
    disp = iVar1 + disp;
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local,(uint)ext1._1_1_);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Cpcc::Cpcc(local_3c,(uint)(byte)ext1);
    pSVar2 = StrWriter::operator<<(pSVar2,local_3c[0]);
    local_40 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_40);
    Ims<2>::Ims(&local_44,local_34);
    StrWriter::operator<<(pSVar2,local_44);
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local,"; ");
    UInt::UInt(&local_48,disp);
    pSVar2 = StrWriter::operator<<(pSVar2,local_48);
    pSVar2 = StrWriter::operator<<(pSVar2," (extension = ");
    Int::Int(&local_4c,ext2);
    pSVar2 = StrWriter::operator<<(pSVar2,local_4c);
    StrWriter::operator<<(pSVar2,") (2-3)");
  }
  return;
}

Assistant:

void
Moira::dasmCpBcc(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id   = ( ____xxx_________(op) );
    auto cnd  = ( __________xxxxxx(op) );
    auto pc   = addr + 2;
    auto ext1 = dasmIncRead<Word>(addr);
    auto disp = dasmIncRead<S>(addr);
    auto ext2 = dasmIncRead<Word>(addr);

    pc += SEXT<S>(disp);

    str << id << Ins<I>{} << Cpcc{cnd} << str.tab << Ims<Word>(ext2);
    str << "; " << UInt(pc) << " (extension = " << Int(ext1) << ") (2-3)";
}